

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_mtfsf(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  TCGv_i64 dst;
  int32_t val;
  int w;
  int l;
  int flm;
  TCGv_i64 t1;
  TCGv_i32 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
    uVar1 = FPFLM(ctx->opcode);
    uVar2 = FPL(ctx->opcode);
    uVar3 = FPW(ctx->opcode);
    if ((uVar3 & (ctx->insns_flags2 & 0x20) == 0) == 0) {
      gen_reset_fpstatus(tcg_ctx_00);
      if (uVar2 == 0) {
        t1 = (TCGv_i64)tcg_const_i32_ppc64(tcg_ctx_00,uVar1 << ((byte)(uVar3 << 3) & 0x1f));
      }
      else {
        val = 0xff;
        if ((ctx->insns_flags2 & 0x20) != 0) {
          val = 0xffff;
        }
        t1 = (TCGv_i64)tcg_const_i32_ppc64(tcg_ctx_00,val);
      }
      dst = tcg_temp_new_i64(tcg_ctx_00);
      uVar1 = rB(ctx->opcode);
      get_fpr(tcg_ctx_00,dst,uVar1);
      gen_helper_store_fpscr(tcg_ctx_00,tcg_ctx_00->cpu_env,dst,(TCGv_i32)t1);
      tcg_temp_free_i32(tcg_ctx_00,(TCGv_i32)t1);
      uVar1 = Rc(ctx->opcode);
      if (uVar1 != 0) {
        tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,cpu_crf[1],cpu_fpscr);
        tcg_gen_shri_i32_ppc64(tcg_ctx_00,cpu_crf[1],cpu_crf[1],0x1c);
      }
      gen_helper_float_check_status(tcg_ctx_00,tcg_ctx_00->cpu_env);
      tcg_temp_free_i64(tcg_ctx_00,dst);
    }
    else {
      gen_inval_exception(ctx,1);
    }
  }
  else {
    gen_exception(ctx,7);
  }
  return;
}

Assistant:

static void gen_mtfsf(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0;
    TCGv_i64 t1;
    int flm, l, w;

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    flm = FPFLM(ctx->opcode);
    l = FPL(ctx->opcode);
    w = FPW(ctx->opcode);
    if (unlikely(w & !(ctx->insns_flags2 & PPC2_ISA205))) {
        gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
        return;
    }
    gen_reset_fpstatus(tcg_ctx);
    if (l) {
        t0 = tcg_const_i32(tcg_ctx, (ctx->insns_flags2 & PPC2_ISA205) ? 0xffff : 0xff);
    } else {
        t0 = tcg_const_i32(tcg_ctx, flm << (w * 8));
    }
    t1 = tcg_temp_new_i64(tcg_ctx);
    get_fpr(tcg_ctx, t1, rB(ctx->opcode));
    gen_helper_store_fpscr(tcg_ctx, tcg_ctx->cpu_env, t1, t0);
    tcg_temp_free_i32(tcg_ctx, t0);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        tcg_gen_trunc_tl_i32(tcg_ctx, cpu_crf[1], cpu_fpscr);
        tcg_gen_shri_i32(tcg_ctx, cpu_crf[1], cpu_crf[1], FPSCR_OX);
    }
    /* We can raise a deferred exception */
    gen_helper_float_check_status(tcg_ctx, tcg_ctx->cpu_env);
    tcg_temp_free_i64(tcg_ctx, t1);
}